

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageFormat(Image *image,int newFormat)

{
  ushort uVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined6 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int i_1;
  float *__ptr;
  ulong uVar11;
  void *pvVar12;
  float *pfVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int i;
  char cVar19;
  char cVar20;
  float fVar21;
  float fStack_54;
  
  pvVar12 = image->data;
  if ((((pvVar12 != (void *)0x0) && (image->width != 0)) && (newFormat != 0 && image->height != 0))
     && (iVar15 = image->format, iVar15 != newFormat)) {
    if (10 < newFormat || 10 < iVar15) {
      TraceLog(4,"IMAGE: Data format is compressed, can not be converted");
      return;
    }
    uVar14 = image->height * image->width;
    __ptr = (float *)malloc((long)(int)uVar14 << 4);
    uVar11 = 0;
    uVar16 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar16 = uVar11;
    }
    pfVar13 = __ptr + 3;
    iVar17 = 0;
    for (; uVar16 != uVar11; uVar11 = uVar11 + 1) {
      if (9 < iVar15 - 1U) goto LAB_00135629;
      lVar18 = (long)iVar17;
      switch(iVar15) {
      case 1:
        fVar21 = (float)*(byte *)((long)pvVar12 + uVar11) / 255.0;
        pfVar13[-3] = fVar21;
        pfVar13[-2] = fVar21;
        pfVar13[-1] = fVar21;
        goto LAB_0013550e;
      case 2:
        fVar21 = (float)*(byte *)((long)pvVar12 + lVar18) / 255.0;
        pfVar13[-3] = fVar21;
        pfVar13[-2] = fVar21;
        pfVar13[-1] = fVar21;
        *pfVar13 = (float)*(byte *)((long)pvVar12 + lVar18 + 1) / 255.0;
        iVar17 = iVar17 + 2;
        break;
      case 3:
        uVar1 = *(ushort *)((long)pvVar12 + uVar11 * 2);
        pfVar13[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
        pfVar13[-2] = (float)(uVar1 >> 5 & 0x3f) * 0.015873017;
        pfVar13[-1] = (float)(uVar1 & 0x1f) * 0.032258064;
        goto LAB_0013550e;
      case 4:
        pfVar13[-3] = (float)*(byte *)((long)pvVar12 + lVar18) / 255.0;
        pfVar13[-2] = (float)*(byte *)((long)pvVar12 + lVar18 + 1) / 255.0;
        fVar21 = (float)*(byte *)((long)pvVar12 + lVar18 + 2) / 255.0;
        goto LAB_00135619;
      case 5:
        uVar1 = *(ushort *)((long)pvVar12 + uVar11 * 2);
        pfVar13[-3] = (float)(uVar1 >> 0xb) * 0.032258064;
        pfVar13[-2] = (float)(uVar1 >> 6 & 0x1f) * 0.032258064;
        pfVar13[-1] = (float)(uVar1 >> 1 & 0x1f) * 0.032258064;
        fVar21 = 0.0;
        if ((uVar1 & 1) != 0) {
          fVar21 = 1.0;
        }
        *pfVar13 = fVar21;
        break;
      case 6:
        uVar1 = *(ushort *)((long)pvVar12 + uVar11 * 2);
        pfVar13[-3] = (float)(uVar1 >> 0xc) * 0.06666667;
        pfVar13[-2] = (float)(uVar1 >> 8 & 0xf) * 0.06666667;
        pfVar13[-1] = (float)(uVar1 >> 4 & 0xf) * 0.06666667;
        *pfVar13 = (float)(uVar1 & 0xf) * 0.06666667;
        break;
      case 7:
        pfVar13[-3] = (float)*(byte *)((long)pvVar12 + lVar18) / 255.0;
        pfVar13[-2] = (float)*(byte *)((long)pvVar12 + lVar18 + 1) / 255.0;
        pfVar13[-1] = (float)*(byte *)((long)pvVar12 + lVar18 + 2) / 255.0;
        fVar21 = (float)*(byte *)((long)pvVar12 + lVar18 + 3) / 255.0;
        goto LAB_001355f2;
      case 8:
        pfVar13[-3] = *(float *)((long)pvVar12 + lVar18 * 4);
        pfVar13[-2] = 0.0;
        pfVar13[-1] = 0.0;
LAB_0013550e:
        *pfVar13 = 1.0;
        break;
      case 9:
        pfVar13[-3] = *(float *)((long)pvVar12 + lVar18 * 4);
        pfVar13[-2] = *(float *)((long)pvVar12 + lVar18 * 4 + 4);
        fVar21 = *(float *)((long)pvVar12 + lVar18 * 4 + 8);
LAB_00135619:
        pfVar13[-1] = fVar21;
        *pfVar13 = 1.0;
        iVar17 = iVar17 + 3;
        break;
      case 10:
        pfVar13[-3] = *(float *)((long)pvVar12 + lVar18 * 4);
        pfVar13[-2] = *(float *)((long)pvVar12 + lVar18 * 4 + 4);
        pfVar13[-1] = *(float *)((long)pvVar12 + lVar18 * 4 + 8);
        fVar21 = *(float *)((long)pvVar12 + lVar18 * 4 + 0xc);
LAB_001355f2:
        *pfVar13 = fVar21;
        iVar17 = iVar17 + 4;
      }
LAB_00135629:
      pfVar13 = pfVar13 + 4;
    }
    free(pvVar12);
    image->data = (void *)0x0;
    image->format = newFormat;
    switch(newFormat) {
    case 1:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar17 * iVar15));
      image->data = pvVar12;
      pfVar13 = __ptr + 2;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15; lVar18 = lVar18 + 1) {
        *(char *)((long)image->data + lVar18) =
             (char)(int)((*pfVar13 * 0.114 + pfVar13[-2] * 0.299 + pfVar13[-1] * 0.587) * 255.0);
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 2:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar15 * iVar17 * 2));
      image->data = pvVar12;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15 * 2; lVar18 = lVar18 + 2) {
        *(char *)((long)image->data + lVar18) =
             (char)(int)((__ptr[lVar18 * 2 + 2] * 0.114 +
                         __ptr[lVar18 * 2] * 0.299 + __ptr[lVar18 * 2 + 1] * 0.587) * 255.0);
        *(char *)((long)image->data + lVar18 + 1) = (char)(int)(__ptr[lVar18 * 2 + 3] * 255.0);
        iVar15 = image->width;
        iVar17 = image->height;
      }
      break;
    case 3:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar17 * iVar15) * 2);
      image->data = pvVar12;
      pfVar13 = __ptr + 2;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15; lVar18 = lVar18 + 1) {
        fVar21 = roundf(*pfVar13 * 31.0);
        fVar7 = (float)*(undefined8 *)(pfVar13 + -2) * 31.0;
        fVar9 = (float)((ulong)*(undefined8 *)(pfVar13 + -2) >> 0x20) * 63.0;
        fVar8 = roundf(fVar7);
        fStack_54 = (float)(CONCAT17((char)((uint)fVar9 >> 0x18),
                                     CONCAT16((char)((uint)fVar9 >> 0x10),
                                              CONCAT15((char)((uint)fVar9 >> 8),
                                                       CONCAT14(SUB41(fVar9,0),fVar7)))) >> 0x20);
        fVar7 = roundf(fStack_54);
        iVar15 = (int)fVar8;
        iVar17 = (int)fVar7;
        cVar20 = (char)((uint)iVar17 >> 0x10);
        uVar6 = CONCAT15((char)((uint)iVar17 >> 8),CONCAT14((char)iVar17,iVar15));
        sVar3 = (short)iVar15;
        sVar4 = (short)((uint6)uVar6 >> 0x20);
        sVar5 = (short)(CONCAT17((char)((uint)iVar17 >> 0x18),CONCAT16(cVar20,uVar6)) >> 0x30);
        *(ushort *)((long)image->data + lVar18 * 2) =
             (ushort)(int)fVar21 & 0xff |
             CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar20 - (0xff < sVar5),
                      (0 < sVar4) * (sVar4 < 0x100) * (char)iVar17 - (0xff < sVar4)) * 0x20 |
             (ushort)(byte)((0 < sVar3) * (sVar3 < 0x100) * (char)iVar15 - (0xff < sVar3)) * 0x800;
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 4:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar15 * iVar17 * 3));
      image->data = pvVar12;
      pfVar13 = __ptr + 2;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15 * 3; lVar18 = lVar18 + 3) {
        *(char *)((long)image->data + lVar18) = (char)(int)(pfVar13[-2] * 255.0);
        *(char *)((long)image->data + lVar18 + 1) = (char)(int)(pfVar13[-1] * 255.0);
        *(char *)((long)image->data + lVar18 + 2) = (char)(int)(*pfVar13 * 255.0);
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 5:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar17 * iVar15) * 2);
      image->data = pvVar12;
      pfVar13 = __ptr;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15; lVar18 = lVar18 + 1) {
        fVar7 = roundf(*pfVar13 * 31.0);
        fVar21 = pfVar13[3];
        fVar8 = (float)*(undefined8 *)(pfVar13 + 1) * 31.0;
        fVar10 = (float)((ulong)*(undefined8 *)(pfVar13 + 1) >> 0x20) * 31.0;
        fVar9 = roundf(fVar8);
        fStack_54 = (float)(CONCAT17((char)((uint)fVar10 >> 0x18),
                                     CONCAT16((char)((uint)fVar10 >> 0x10),
                                              CONCAT15((char)((uint)fVar10 >> 8),
                                                       CONCAT14(SUB41(fVar10,0),fVar8)))) >> 0x20);
        fVar8 = roundf(fStack_54);
        iVar15 = (int)fVar9;
        iVar17 = (int)fVar8;
        cVar19 = (char)((uint)iVar17 >> 0x10);
        uVar6 = CONCAT15((char)((uint)iVar17 >> 8),CONCAT14((char)iVar17,iVar15));
        sVar3 = (short)iVar15;
        cVar20 = (0 < sVar3) * (sVar3 < 0x100) * (char)iVar15 - (0xff < sVar3);
        sVar3 = (short)((uint)iVar15 >> 0x10);
        sVar4 = (short)((uint6)uVar6 >> 0x20);
        cVar2 = (0 < sVar4) * (sVar4 < 0x100) * (char)iVar17 - (0xff < sVar4);
        sVar4 = (short)(CONCAT17((char)((uint)iVar17 >> 0x18),CONCAT16(cVar19,uVar6)) >> 0x30);
        sVar5 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * (char)((uint)iVar15 >> 0x10) -
                         (0xff < sVar3),cVar20);
        sVar3 = (short)(CONCAT13((0 < sVar4) * (sVar4 < 0x100) * cVar19 - (0xff < sVar4),
                                 CONCAT12(cVar2,sVar5)) >> 0x10);
        uVar1 = (ushort)(byte)((0 < sVar5) * (sVar5 < 0x100) * cVar20 - (0xff < sVar5)) * 0x40;
        sVar3 = (ushort)(byte)((0 < sVar3) * (sVar3 < 0x100) * cVar2 - (0xff < sVar3)) * 2;
        *(ushort *)((long)image->data + lVar18 * 2) =
             (ushort)(CONCAT13((char)((ushort)sVar3 >> 8),CONCAT12((char)sVar3,uVar1)) >> 0x10) |
             uVar1 | (ushort)(0.19607843 < fVar21) | (ushort)((int)fVar7 << 0xb);
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 6:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar17 * iVar15) * 2);
      image->data = pvVar12;
      pfVar13 = __ptr;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15; lVar18 = lVar18 + 1) {
        fVar21 = roundf(*pfVar13 * 15.0);
        fVar7 = roundf(pfVar13[3] * 15.0);
        fVar8 = (float)*(undefined8 *)(pfVar13 + 1) * 15.0;
        fVar10 = (float)((ulong)*(undefined8 *)(pfVar13 + 1) >> 0x20) * 15.0;
        fVar9 = roundf(fVar8);
        fStack_54 = (float)(CONCAT17((char)((uint)fVar10 >> 0x18),
                                     CONCAT16((char)((uint)fVar10 >> 0x10),
                                              CONCAT15((char)((uint)fVar10 >> 8),
                                                       CONCAT14(SUB41(fVar10,0),fVar8)))) >> 0x20);
        fVar8 = roundf(fStack_54);
        iVar15 = (int)fVar9;
        iVar17 = (int)fVar8;
        cVar19 = (char)((uint)iVar17 >> 0x10);
        uVar6 = CONCAT15((char)((uint)iVar17 >> 8),CONCAT14((char)iVar17,iVar15));
        sVar3 = (short)iVar15;
        cVar20 = (0 < sVar3) * (sVar3 < 0x100) * (char)iVar15 - (0xff < sVar3);
        sVar3 = (short)((uint)iVar15 >> 0x10);
        sVar4 = (short)((uint6)uVar6 >> 0x20);
        cVar2 = (0 < sVar4) * (sVar4 < 0x100) * (char)iVar17 - (0xff < sVar4);
        sVar4 = (short)(CONCAT17((char)((uint)iVar17 >> 0x18),CONCAT16(cVar19,uVar6)) >> 0x30);
        sVar5 = CONCAT11((0 < sVar3) * (sVar3 < 0x100) * (char)((uint)iVar15 >> 0x10) -
                         (0xff < sVar3),cVar20);
        sVar3 = (short)(CONCAT13((0 < sVar4) * (sVar4 < 0x100) * cVar19 - (0xff < sVar4),
                                 CONCAT12(cVar2,sVar5)) >> 0x10);
        uVar1 = (ushort)(byte)((0 < sVar5) * (sVar5 < 0x100) * cVar20 - (0xff < sVar5)) * 0x100;
        sVar3 = (ushort)(byte)((0 < sVar3) * (sVar3 < 0x100) * cVar2 - (0xff < sVar3)) * 0x10;
        *(ushort *)((long)image->data + lVar18 * 2) =
             (ushort)(int)fVar7 & 0xff |
             (ushort)(CONCAT13((char)((ushort)sVar3 >> 8),CONCAT12((char)sVar3,uVar1)) >> 0x10) |
             uVar1 | (ushort)((int)fVar21 << 0xc);
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 7:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar15 * iVar17 * 4));
      image->data = pvVar12;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15 * 4; lVar18 = lVar18 + 4) {
        *(char *)((long)image->data + lVar18) = (char)(int)(__ptr[lVar18] * 255.0);
        *(char *)((long)image->data + lVar18 + 1) = (char)(int)(__ptr[lVar18 + 1] * 255.0);
        *(char *)((long)image->data + lVar18 + 2) = (char)(int)(__ptr[lVar18 + 2] * 255.0);
        *(char *)((long)image->data + lVar18 + 3) = (char)(int)(__ptr[lVar18 + 3] * 255.0);
        iVar15 = image->width;
        iVar17 = image->height;
      }
      break;
    case 8:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar17 * iVar15) << 2);
      image->data = pvVar12;
      pfVar13 = __ptr + 2;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15; lVar18 = lVar18 + 1) {
        *(float *)((long)image->data + lVar18 * 4) =
             *pfVar13 * 0.114 + pfVar13[-2] * 0.299 + pfVar13[-1] * 0.587;
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 9:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar15 * iVar17 * 3) << 2);
      image->data = pvVar12;
      pfVar13 = __ptr + 2;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15 * 3; lVar18 = lVar18 + 3) {
        *(float *)((long)image->data + lVar18 * 4) = pfVar13[-2];
        *(float *)((long)image->data + lVar18 * 4 + 4) = pfVar13[-1];
        *(float *)((long)image->data + lVar18 * 4 + 8) = *pfVar13;
        iVar15 = image->width;
        iVar17 = image->height;
        pfVar13 = pfVar13 + 4;
      }
      break;
    case 10:
      iVar15 = image->width;
      iVar17 = image->height;
      pvVar12 = malloc((long)(iVar15 * iVar17 * 4) << 2);
      image->data = pvVar12;
      for (lVar18 = 0; lVar18 < iVar17 * iVar15 * 4; lVar18 = lVar18 + 4) {
        *(float *)((long)image->data + lVar18 * 4) = __ptr[lVar18];
        *(float *)((long)image->data + lVar18 * 4 + 4) = __ptr[lVar18 + 1];
        *(float *)((long)image->data + lVar18 * 4 + 8) = __ptr[lVar18 + 2];
        *(float *)((long)image->data + lVar18 * 4 + 0xc) = __ptr[lVar18 + 3];
        iVar15 = image->width;
        iVar17 = image->height;
      }
    }
    free(__ptr);
    if ((1 < image->mipmaps) && (image->mipmaps = 1, image->data != (void *)0x0)) {
      ImageMipmaps(image);
      return;
    }
  }
  return;
}

Assistant:

void ImageFormat(Image *image, int newFormat)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if ((newFormat != 0) && (image->format != newFormat))
    {
        if ((image->format < PIXELFORMAT_COMPRESSED_DXT1_RGB) && (newFormat < PIXELFORMAT_COMPRESSED_DXT1_RGB))
        {
            Vector4 *pixels = LoadImageDataNormalized(*image);     // Supports 8 to 32 bit per channel

            RL_FREE(image->data);      // WARNING! We loose mipmaps data --> Regenerated at the end...
            image->data = NULL;
            image->format = newFormat;

            int k = 0;

            switch (image->format)
            {
                case PIXELFORMAT_UNCOMPRESSED_GRAYSCALE:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f)*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*2*sizeof(unsigned char));

                    for (int i = 0; i < image->width*image->height*2; i += 2, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)((pixels[k].x*0.299f + (float)pixels[k].y*0.587f + (float)pixels[k].z*0.114f)*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].w*255.0f);
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G6B5:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*63.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 5 | (unsigned short)b;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*3*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R5G5B5A1:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*31.0f));
                        g = (unsigned char)(round(pixels[i].y*31.0f));
                        b = (unsigned char)(round(pixels[i].z*31.0f));
                        a = (pixels[i].w > ((float)PIXELFORMAT_UNCOMPRESSED_R5G5B5A1_ALPHA_THRESHOLD/255.0f))? 1 : 0;

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 11 | (unsigned short)g << 6 | (unsigned short)b << 1 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R4G4B4A4:
                {
                    image->data = (unsigned short *)RL_MALLOC(image->width*image->height*sizeof(unsigned short));

                    unsigned char r = 0;
                    unsigned char g = 0;
                    unsigned char b = 0;
                    unsigned char a = 0;

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        r = (unsigned char)(round(pixels[i].x*15.0f));
                        g = (unsigned char)(round(pixels[i].y*15.0f));
                        b = (unsigned char)(round(pixels[i].z*15.0f));
                        a = (unsigned char)(round(pixels[i].w*15.0f));

                        ((unsigned short *)image->data)[i] = (unsigned short)r << 12 | (unsigned short)g << 8 | (unsigned short)b << 4 | (unsigned short)a;
                    }

                } break;
                case PIXELFORMAT_UNCOMPRESSED_R8G8B8A8:
                {
                    image->data = (unsigned char *)RL_MALLOC(image->width*image->height*4*sizeof(unsigned char));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((unsigned char *)image->data)[i] = (unsigned char)(pixels[k].x*255.0f);
                        ((unsigned char *)image->data)[i + 1] = (unsigned char)(pixels[k].y*255.0f);
                        ((unsigned char *)image->data)[i + 2] = (unsigned char)(pixels[k].z*255.0f);
                        ((unsigned char *)image->data)[i + 3] = (unsigned char)(pixels[k].w*255.0f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32:
                {
                    // WARNING: Image is converted to GRAYSCALE eqeuivalent 32bit

                    image->data = (float *)RL_MALLOC(image->width*image->height*sizeof(float));

                    for (int i = 0; i < image->width*image->height; i++)
                    {
                        ((float *)image->data)[i] = (float)(pixels[i].x*0.299f + pixels[i].y*0.587f + pixels[i].z*0.114f);
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*3*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*3; i += 3, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                    }
                } break;
                case PIXELFORMAT_UNCOMPRESSED_R32G32B32A32:
                {
                    image->data = (float *)RL_MALLOC(image->width*image->height*4*sizeof(float));

                    for (int i = 0, k = 0; i < image->width*image->height*4; i += 4, k++)
                    {
                        ((float *)image->data)[i] = pixels[k].x;
                        ((float *)image->data)[i + 1] = pixels[k].y;
                        ((float *)image->data)[i + 2] = pixels[k].z;
                        ((float *)image->data)[i + 3] = pixels[k].w;
                    }
                } break;
                default: break;
            }

            RL_FREE(pixels);
            pixels = NULL;

            // In case original image had mipmaps, generate mipmaps for formated image
            // NOTE: Original mipmaps are replaced by new ones, if custom mipmaps were used, they are lost
            if (image->mipmaps > 1)
            {
                image->mipmaps = 1;
            #if defined(SUPPORT_IMAGE_MANIPULATION)
                if (image->data != NULL) ImageMipmaps(image);
            #endif
            }
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Data format is compressed, can not be converted");
    }
}